

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O1

ze_result_t driver::zeMemPutIpcHandle(ze_context_handle_t hContext,ze_ipc_mem_handle_t handle)

{
  ze_result_t zVar1;
  
  if (DAT_0010e4d8 != (code *)0x0) {
    zVar1 = (*DAT_0010e4d8)();
    return zVar1;
  }
  return ZE_RESULT_SUCCESS;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeMemPutIpcHandle(
        ze_context_handle_t hContext,                   ///< [in] handle of the context object
        ze_ipc_mem_handle_t handle                      ///< [in] IPC memory handle
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnPutIpcHandle = context.zeDdiTable.Mem.pfnPutIpcHandle;
        if( nullptr != pfnPutIpcHandle )
        {
            result = pfnPutIpcHandle( hContext, handle );
        }
        else
        {
            // generic implementation
        }

        return result;
    }